

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

void BinaryCache::RemoveBytecode(char *path)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  uVar8 = NULLC::GetStringHash(path);
  if ((ulong)DAT_0041ef2c != 0) {
    uVar11 = 0;
    lVar10 = 0;
    do {
      if (uVar8 == *(uint *)(cache + 8 + lVar10)) {
        (*(code *)NULLC::dealloc)(*(undefined8 *)(cache + lVar10));
        if (uVar11 < DAT_0041ef2c) {
          pvVar3 = *(void **)(cache + 0x10 + lVar10);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          if (uVar11 < DAT_0041ef2c) {
            pvVar3 = *(void **)(cache + 0x18 + lVar10);
            if ((pvVar3 != (void *)0x0) && (operator_delete__(pvVar3), DAT_0041ef2c == 0)) {
              __assert_fail("count > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x62,
                            "T &FastVector<BinaryCache::CodeDescriptor>::back() [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                           );
            }
            lVar7 = cache;
            if (uVar11 < DAT_0041ef2c) {
              uVar9 = (ulong)(DAT_0041ef2c - 1);
              *(undefined8 *)(cache + 0x20 + lVar10) = *(undefined8 *)(cache + 0x20 + uVar9 * 0x28);
              puVar1 = (undefined8 *)(lVar7 + uVar9 * 0x28);
              uVar4 = *puVar1;
              uVar5 = puVar1[1];
              puVar1 = (undefined8 *)(lVar7 + 0x10 + uVar9 * 0x28);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)(lVar7 + 0x10 + lVar10);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              *(undefined8 *)(lVar7 + lVar10) = uVar4;
              ((undefined8 *)(lVar7 + lVar10))[1] = uVar5;
              DAT_0041ef2c = DAT_0041ef2c - 1;
              return;
            }
          }
        }
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      lVar10 = lVar10 + 0x28;
      uVar11 = uVar11 + 1;
    } while ((ulong)DAT_0041ef2c * 0x28 != lVar10);
  }
  return;
}

Assistant:

void BinaryCache::RemoveBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i == cache.size())
		return;

	NULLC::dealloc((void*)cache[i].name);
	delete[] cache[i].binary;
	delete[] cache[i].lexemes;

	cache[i] = cache.back();
	cache.pop_back();
}